

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O3

void LiteScript::StateExecutor::Execute(State *state,Instruction *instr)

{
  pointer pVVar1;
  bool bVar2;
  Object *pOVar3;
  Type *this;
  
  pVVar1 = (state->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar1 != (state->op_lifo).
                super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                _M_impl.super__Vector_impl_data._M_start) {
    pOVar3 = Variable::operator->(pVVar1 + -1);
    this = Object::GetType(pOVar3);
    bVar2 = Type::operator==(this,(Type *)_type_class_object);
    if (bVar2) {
      pOVar3 = Variable::operator->
                         ((state->op_lifo).
                          super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1);
      *(State **)((long)pOVar3->data + 0x40) = state;
    }
  }
  (*ARRAY._M_elems[instr->code])(state,instr);
  return;
}

Assistant:

void LiteScript::StateExecutor::Execute(State &state, Instruction &instr) {
    if (state.op_lifo.size() > 0 && state.op_lifo.back()->GetType() == Type::CLASS_OBJECT)
        state.op_lifo.back()->GetData<ClassObject>().ScriptState = &state;
    StateExecutor::ARRAY[instr.code](state, instr);
}